

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t
zesDeviceEnumOverclockDomains
          (zes_device_handle_t hDevice,uint32_t *pCount,zes_overclock_handle_t *phDomainHandle)

{
  zes_pfnDeviceEnumOverclockDomains_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnDeviceEnumOverclockDomains_t pfnEnumOverclockDomains;
  zes_overclock_handle_t *phDomainHandle_local;
  uint32_t *pCount_local;
  zes_device_handle_t hDevice_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Device).pfnEnumOverclockDomains;
    if (p_Var1 == (zes_pfnDeviceEnumOverclockDomains_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hDevice_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hDevice_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hDevice_local._4_4_ = (*p_Var1)(hDevice,pCount,phDomainHandle);
    }
  }
  else {
    hDevice_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hDevice_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesDeviceEnumOverclockDomains(
    zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
    uint32_t* pCount,                               ///< [in,out] pointer to the number of components of this type.
                                                    ///< if count is zero, then the driver shall update the value with the
                                                    ///< total number of components of this type that are available.
                                                    ///< if count is greater than the number of components of this type that
                                                    ///< are available, then the driver shall update the value with the correct
                                                    ///< number of components.
    zes_overclock_handle_t* phDomainHandle          ///< [in,out][optional][range(0, *pCount)] array of handle of components of
                                                    ///< this type.
                                                    ///< if count is less than the number of components of this type that are
                                                    ///< available, then the driver shall only retrieve that number of
                                                    ///< component handles.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnDeviceEnumOverclockDomains_t pfnEnumOverclockDomains = [&result] {
        auto pfnEnumOverclockDomains = ze_lib::context->zesDdiTable.load()->Device.pfnEnumOverclockDomains;
        if( nullptr == pfnEnumOverclockDomains ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnEnumOverclockDomains;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnEnumOverclockDomains( hDevice, pCount, phDomainHandle );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnEnumOverclockDomains = ze_lib::context->zesDdiTable.load()->Device.pfnEnumOverclockDomains;
    if( nullptr == pfnEnumOverclockDomains ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnEnumOverclockDomains( hDevice, pCount, phDomainHandle );
    #endif
}